

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

void arc_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Style local_48;
  Am_Style fs;
  Am_Style ls;
  int angle2;
  int angle1;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar7 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x67,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0xa7,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0xa8,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&fs,pAVar7);
  pAVar7 = Am_Object::Get(self,0x6a,0);
  Am_Style::Am_Style(&local_48,pAVar7);
  if ((0 < (int)uVar3) && (0 < iVar4)) {
    (*drawonable->_vptr_Am_Drawonable[0x26])
              (drawonable,&fs,&local_48,(ulong)(uint)(iVar1 + x_offset),
               (ulong)(uint)(iVar2 + y_offset),(ulong)uVar3,iVar4,iVar5,iVar6,7,1);
  }
  Am_Style::~Am_Style(&local_48);
  Am_Style::~Am_Style(&fs);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, arc_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  int angle1 = self.Get(Am_ANGLE1);
  int angle2 = self.Get(Am_ANGLE2);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  Am_Style fs = self.Get(Am_FILL_STYLE);
  if ((width > 0) && (height > 0))
    drawonable->Draw_Arc(ls, fs, left, top, width, height, angle1, angle2,
                         Am_DRAW_MASK_COPY);
}